

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  undefined4 extraout_var;
  int64 iVar2;
  CodedOutputStream o;
  ArrayOutputStream array_stream;
  CodedOutputStream local_90;
  ArrayOutputStream local_40;
  
  io::ArrayOutputStream::ArrayOutputStream(&local_40,output->ptr,0x7fffffff,-1);
  io::CodedOutputStream::CodedOutputStream(&local_90,&local_40.super_ZeroCopyOutputStream,true);
  local_90.impl_.is_serialization_deterministic_ = output->is_deterministic;
  iVar1 = (*msg->_vptr_MessageLite[0xe])(msg,local_90.cur_,&local_90);
  local_90.cur_ = (uint8 *)CONCAT44(extraout_var,iVar1);
  iVar2 = io::EpsCopyOutputStream::ByteCount(&local_90.impl_,local_90.cur_);
  output->ptr = output->ptr + ((int)iVar2 - (int)local_90.start_count_);
  io::CodedOutputStream::~CodedOutputStream(&local_90);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}